

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CGL::HalfedgeMesh::build
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *vertexPositions,
          vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *texcoords)

{
  bool bVar1;
  size_type sVar2;
  reference puVar3;
  pointer pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  pointer ppVar9;
  FaceIter *pFVar10;
  VertexIter *pVVar11;
  VertexIter *pVVar12;
  pointer pEVar13;
  EdgeIter *pEVar14;
  reference pvVar15;
  HalfedgeIter *pHVar16;
  HalfedgeIter *pHVar17;
  pointer pHVar18;
  pointer pFVar19;
  mapped_type *pmVar20;
  size_type sVar21;
  size_type sVar22;
  ostream *poVar23;
  pointer ppVar24;
  const_reference pvVar25;
  pointer pVVar26;
  const_reference pvVar27;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *in_RCX;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *in_RDX;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_RSI;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar28;
  VertexIter v_5;
  VertexIter v_4;
  const_iterator e_2;
  int i;
  HalfedgeIter h_2;
  Size count;
  VertexIter v_3;
  VertexIter v_2;
  Index q;
  Index p_2;
  Size degree_2;
  EdgeIter e_1;
  HalfedgeIter t;
  HalfedgeIter i_5;
  vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
  boundaryHalfedges;
  FaceIter b_1;
  HalfedgeIter h_1;
  HalfedgeIter h;
  VertexIter v_1;
  Index j;
  Index i_4;
  EdgeIter e;
  HalfedgeIter hba;
  iterator iba;
  IndexPair ba;
  HalfedgeIter hab;
  IndexPair ab;
  Index b;
  Index a;
  Index i_3;
  Size degree_1;
  vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
  faceHalfedges;
  FaceIter f;
  PolygonListCIter p;
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
  pairToHalfedge;
  Size nFaces;
  Size nVertices;
  IndexListCIter i_2;
  Size degree;
  VertexIter v;
  IndexListCIter i_1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> polygonIndices;
  PolygonListCIter p_1;
  map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
  vertexDegree;
  map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
  indexToVertex;
  HalfedgeMesh *in_stack_fffffffffffff918;
  list<CGL::Edge,_std::allocator<CGL::Edge>_> *in_stack_fffffffffffff920;
  HalfedgeMesh *in_stack_fffffffffffff928;
  vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
  *in_stack_fffffffffffff930;
  value_type_conflict *in_stack_fffffffffffff938;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffff940;
  size_type in_stack_fffffffffffff948;
  list<CGL::Face,_std::allocator<CGL::Face>_> *in_stack_fffffffffffff950;
  key_type *in_stack_fffffffffffff958;
  map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
  *in_stack_fffffffffffff960;
  HalfedgeMesh *in_stack_fffffffffffff988;
  mapped_type mVar29;
  HalfedgeMesh *in_stack_fffffffffffff9e8;
  HalfedgeMesh *in_stack_fffffffffffff9f8;
  bool local_5c1;
  Vertex *in_stack_fffffffffffffb40;
  _Self local_398;
  _Self local_390;
  _Base_ptr local_388;
  _List_node_base *local_380;
  iterator local_378;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>
  local_370;
  iterator local_368;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>
  local_360;
  int local_354;
  _List_node_base *local_350;
  _Self local_348;
  mapped_type local_340;
  _Self local_338;
  _Self local_330;
  _Self local_328;
  _List_node_base *local_320;
  _Self local_318;
  _Self local_310;
  _List_node_base *local_308;
  ulong local_300;
  ulong local_2f8;
  ulong local_2f0;
  _Self local_2e8;
  _List_node_base *local_2e0;
  _List_node_base *local_2d8;
  _Self local_2d0;
  vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
  local_2c8;
  _List_node_base *local_2b0;
  _Self local_2a8;
  _Self local_2a0;
  _Self local_298;
  _List_node_base *local_290;
  _Self local_288;
  _Self local_280;
  _Self local_278;
  _Self local_270;
  _List_node_base *local_268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_260;
  ulong local_258;
  ulong local_250;
  _List_node_base *local_248;
  _List_node_base *local_240;
  _List_node_base *local_238;
  _Self local_230;
  _Self local_228;
  pair<unsigned_long,_unsigned_long> local_220;
  _List_node_base *local_210;
  _Self local_208;
  _Self local_200;
  _List_iterator<CGL::Halfedge> local_1f8;
  pair<unsigned_long,_unsigned_long> local_1f0;
  value_type local_1e0;
  value_type local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
  local_1c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1a8;
  _List_node_base *local_1a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_198;
  _List_iterator<CGL::Face> local_190;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_188 [7];
  size_type local_150;
  size_type local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_140;
  unsigned_long *local_138;
  unsigned_long *local_130;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_128;
  ulong local_120;
  unsigned_long *local_118;
  _List_node_base *local_110;
  _List_node_base *local_108;
  _Self local_100;
  _Self local_f8;
  _Base_ptr local_f0;
  undefined1 local_e8;
  unsigned_long *local_e0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d8 [9];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_90;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_88 [13];
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> *local_20;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> *local_18;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::list<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>::clear
            ((list<CGL::Halfedge,_std::allocator<CGL::Halfedge>_> *)in_stack_fffffffffffff920);
  std::__cxx11::list<CGL::Vertex,_std::allocator<CGL::Vertex>_>::clear
            ((list<CGL::Vertex,_std::allocator<CGL::Vertex>_> *)in_stack_fffffffffffff920);
  std::__cxx11::list<CGL::Edge,_std::allocator<CGL::Edge>_>::clear(in_stack_fffffffffffff920);
  std::__cxx11::list<CGL::Face,_std::allocator<CGL::Face>_>::clear
            ((list<CGL::Face,_std::allocator<CGL::Face>_> *)in_stack_fffffffffffff920);
  std::__cxx11::list<CGL::Face,_std::allocator<CGL::Face>_>::clear
            ((list<CGL::Face,_std::allocator<CGL::Face>_> *)in_stack_fffffffffffff920);
  std::
  map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
  ::map((map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
         *)0x13b7ad);
  std::
  map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
  ::map((map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
         *)0x13b7ba);
  local_88[0]._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
       std::
       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ::begin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)in_stack_fffffffffffff918);
  while( true ) {
    local_90 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::end((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)in_stack_fffffffffffff918);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffff920,
                       (__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffff918);
    if (!bVar1) break;
    pvVar4 = __gnu_cxx::
             __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator->(local_88);
    sVar21 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar4);
    if (sVar21 < 3) {
      poVar23 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: each polygon must have at least three vertices."
                               );
      std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0x13b880);
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::operator->(local_88);
    local_d8[0]._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffff918);
    while( true ) {
      __gnu_cxx::
      __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator->(local_88);
      local_e0 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffff918);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffff920,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffff918);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_d8);
      pVar28 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               insert(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
      local_f0 = (_Base_ptr)pVar28.first._M_node;
      local_e8 = pVar28.second;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_d8);
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
           ::find((map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                   *)in_stack_fffffffffffff918,(key_type *)0x13b941);
      local_100._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
           ::end((map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                  *)in_stack_fffffffffffff918);
      bVar1 = std::operator==(&local_f8,&local_100);
      if (bVar1) {
        local_108 = (_List_node_base *)newVertex(in_stack_fffffffffffff928);
        local_110 = (_List_node_base *)
                    std::__cxx11::list<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>::end
                              (&in_stack_fffffffffffff918->halfedges);
        pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                            ((_List_iterator<CGL::Vertex> *)0x13b9d7);
        pHVar17 = Vertex::halfedge(pVVar26);
        pHVar17->_M_node = local_110;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_d8);
        pmVar8 = std::
                 map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                 ::operator[](in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first);
        pmVar8->_M_node = local_108;
        pmVar20 = std::
                  map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                  ::operator[]((map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                                *)in_stack_fffffffffffff960,(key_type *)in_stack_fffffffffffff958);
        *pmVar20 = 1;
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_d8);
        std::
        map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
        ::operator[](in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first);
        pmVar20 = std::
                  map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                  ::operator[]((map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                                *)in_stack_fffffffffffff960,(key_type *)in_stack_fffffffffffff958);
        *pmVar20 = *pmVar20 + 1;
      }
      local_118 = (unsigned_long *)
                  __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffff928,
                               (int)((ulong)in_stack_fffffffffffff920 >> 0x20));
    }
    pvVar4 = __gnu_cxx::
             __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator->(local_88);
    local_120 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar4);
    sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x13bb2c);
    if (sVar2 < local_120) {
      poVar23 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: one of the input polygons does not have distinct vertices!"
                               );
      std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cerr,"(vertex indices:");
      __gnu_cxx::
      __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator->(local_88);
      local_128._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff918);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::operator->(local_88);
        local_130 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff918);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff920,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff918);
        if (!bVar1) break;
        poVar23 = std::operator<<((ostream *)&std::cerr," ");
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_128);
        std::ostream::operator<<(poVar23,*puVar3);
        local_138 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffff928,
                                 (int)((ulong)in_stack_fffffffffffff920 >> 0x20));
      }
      poVar23 = std::operator<<((ostream *)&std::cerr,")");
      std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0x13bc7b);
    local_140 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                __gnu_cxx::
                __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::operator++((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              *)in_stack_fffffffffffff928,
                             (int)((ulong)in_stack_fffffffffffff920 >> 0x20));
  }
  local_148 = std::
              map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
              ::size((map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                      *)0x13bca4);
  local_150 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::size(local_10);
  std::__cxx11::list<CGL::Face,_std::allocator<CGL::Face>_>::resize
            (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  std::
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
  ::map((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
         *)0x13bce9);
  __gnu_cxx::
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::__normal_iterator(local_188);
  std::_List_iterator<CGL::Face>::_List_iterator(&local_190);
  local_198 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::begin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)in_stack_fffffffffffff918);
  local_188[0]._M_current = local_198;
  local_1a0 = (_List_node_base *)
              std::__cxx11::list<CGL::Face,_std::allocator<CGL::Face>_>::begin
                        ((list<CGL::Face,_std::allocator<CGL::Face>_> *)in_stack_fffffffffffff918);
  local_190._M_node = local_1a0;
  while( true ) {
    local_1a8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::end((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)in_stack_fffffffffffff918);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffff920,
                       (__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffff918);
    if (!bVar1) break;
    std::
    vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
    ::vector((vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
              *)0x13bd91);
    pvVar4 = __gnu_cxx::
             __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator->(local_188);
    local_1c8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar4);
    for (local_1d0 = 0; local_1d0 < local_1c8; local_1d0 = local_1d0 + 1) {
      pvVar5 = __gnu_cxx::
               __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator*(local_188);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar5,local_1d0);
      local_1d8 = *pvVar6;
      pvVar5 = __gnu_cxx::
               __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator*(local_188);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar5,(local_1d0 + 1) % local_1c8);
      local_1e0 = *pvVar6;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                (&local_1f0,&local_1d8,&local_1e0);
      std::_List_iterator<CGL::Halfedge>::_List_iterator(&local_1f8);
      local_200._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
           ::find((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
                   *)in_stack_fffffffffffff918,(key_type *)0x13be7c);
      local_208._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
           ::end((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
                  *)in_stack_fffffffffffff918);
      bVar1 = std::operator!=(&local_200,&local_208);
      if (bVar1) {
        poVar23 = std::operator<<((ostream *)&std::cerr,
                                  "Error converting polygons to halfedge mesh: found multiple oriented edges with indices ("
                                 );
        poVar23 = (ostream *)std::ostream::operator<<(poVar23,local_1d8);
        poVar23 = std::operator<<(poVar23,", ");
        poVar23 = (ostream *)std::ostream::operator<<(poVar23,local_1e0);
        poVar23 = std::operator<<(poVar23,").");
        std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
        poVar23 = std::operator<<((ostream *)&std::cerr,
                                  "This means that either (i) more than two faces contain this edge (hence the surface is nonmanifold), or"
                                 );
        std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
        poVar23 = std::operator<<((ostream *)&std::cerr,
                                  "(ii) there are exactly two faces containing this edge, but they have the same orientation (hence the surface is"
                                 );
        std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
        poVar23 = std::operator<<((ostream *)&std::cerr,"not consistently oriented.");
        std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      local_210 = (_List_node_base *)newHalfedge(in_stack_fffffffffffff988);
      local_1f8._M_node = local_210;
      pmVar7 = std::
               map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
               ::operator[]((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
                             *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
      pmVar7->_M_node = local_1f8._M_node;
      pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                          ((_List_iterator<CGL::Halfedge> *)0x13c0b5);
      pFVar10 = Halfedge::face(pHVar18);
      pFVar10->_M_node = local_190._M_node;
      pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                          ((_List_iterator<CGL::Halfedge> *)0x13c0e7);
      Halfedge::face(pHVar18);
      pFVar19 = std::_List_iterator<CGL::Face>::operator->((_List_iterator<CGL::Face> *)0x13c106);
      pHVar17 = Face::halfedge(pFVar19);
      pHVar17->_M_node = local_1f8._M_node;
      pmVar8 = std::
               map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
               ::operator[](in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first);
      pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                          ((_List_iterator<CGL::Halfedge> *)0x13c157);
      pVVar11 = Halfedge::vertex(pHVar18);
      pVVar11->_M_node = pmVar8->_M_node;
      pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                          ((_List_iterator<CGL::Halfedge> *)0x13c18c);
      Halfedge::vertex(pHVar18);
      pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                          ((_List_iterator<CGL::Vertex> *)0x13c1ab);
      pHVar17 = Vertex::halfedge(pVVar26);
      pHVar17->_M_node = local_1f8._M_node;
      std::
      vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
      ::push_back(in_stack_fffffffffffff930,(value_type *)in_stack_fffffffffffff928);
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                (&local_220,&local_1e0,&local_1d8);
      local_228._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
           ::find((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
                   *)in_stack_fffffffffffff918,(key_type *)0x13c21d);
      local_230._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
           ::end((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
                  *)in_stack_fffffffffffff918);
      bVar1 = std::operator!=(&local_228,&local_230);
      if (bVar1) {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>
                               *)0x13c277);
        local_238 = (ppVar9->second)._M_node;
        pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                            ((_List_iterator<CGL::Halfedge> *)0x13c290);
        pHVar17 = Halfedge::twin(pHVar18);
        pHVar17->_M_node = local_238;
        pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                            ((_List_iterator<CGL::Halfedge> *)0x13c2c2);
        in_stack_fffffffffffffb40 = (Vertex *)Halfedge::twin(pHVar18);
        (in_stack_fffffffffffffb40->super_HalfedgeElement)._vptr_HalfedgeElement =
             (_func_int **)local_1f8._M_node;
        local_240 = (_List_node_base *)newEdge(in_stack_fffffffffffff9e8);
        pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                            ((_List_iterator<CGL::Halfedge> *)0x13c31b);
        pEVar14 = Halfedge::edge(pHVar18);
        pEVar14->_M_node = local_240;
        pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                            ((_List_iterator<CGL::Halfedge> *)0x13c34d);
        pEVar14 = Halfedge::edge(pHVar18);
        pEVar14->_M_node = local_240;
        pEVar13 = std::_List_iterator<CGL::Edge>::operator->((_List_iterator<CGL::Edge> *)0x13c37f);
        pHVar17 = Edge::halfedge(pEVar13);
        pHVar17->_M_node = local_1f8._M_node;
      }
      else {
        local_248 = (_List_node_base *)
                    std::__cxx11::list<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>::end
                              (&in_stack_fffffffffffff918->halfedges);
        pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                            ((_List_iterator<CGL::Halfedge> *)0x13c3c8);
        pHVar17 = Halfedge::twin(pHVar18);
        pHVar17->_M_node = local_248;
      }
    }
    for (local_250 = 0; local_250 < local_1c8; local_250 = local_250 + 1) {
      local_258 = (local_250 + 1) % local_1c8;
      pvVar15 = std::
                vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
                ::operator[](&local_1c0,local_258);
      std::
      vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
      ::operator[](&local_1c0,local_250);
      pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                          ((_List_iterator<CGL::Halfedge> *)0x13c48c);
      pHVar17 = Halfedge::next(pHVar18);
      pHVar17->_M_node = pvVar15->_M_node;
    }
    std::
    vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
    ::~vector(in_stack_fffffffffffff930);
    local_260 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                __gnu_cxx::
                __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::operator++((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              *)in_stack_fffffffffffff928,
                             (int)((ulong)in_stack_fffffffffffff920 >> 0x20));
    local_268 = (_List_node_base *)std::_List_iterator<CGL::Face>::operator++(&local_190,0);
  }
  local_270._M_node = (_List_node_base *)verticesBegin(in_stack_fffffffffffff918);
  do {
    local_278._M_node = (_List_node_base *)verticesEnd(in_stack_fffffffffffff918);
    bVar1 = std::operator!=(&local_270,&local_278);
    if (!bVar1) {
      local_298._M_node = (_List_node_base *)halfedgesBegin(in_stack_fffffffffffff918);
      while( true ) {
        local_2a0._M_node = (_List_node_base *)halfedgesEnd(in_stack_fffffffffffff918);
        bVar1 = std::operator!=(&local_298,&local_2a0);
        if (!bVar1) break;
        pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                            ((_List_iterator<CGL::Halfedge> *)0x13c76e);
        pHVar17 = Halfedge::twin(pHVar18);
        local_2a8._M_node =
             (_List_node_base *)
             std::__cxx11::list<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>::end
                       (&in_stack_fffffffffffff918->halfedges);
        bVar1 = std::operator==(pHVar17,&local_2a8);
        if (bVar1) {
          local_2b0 = (_List_node_base *)newBoundary(in_stack_fffffffffffff9f8);
          std::
          vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
          ::vector((vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
                    *)0x13c7e7);
          local_2d0._M_node = local_298._M_node;
          do {
            local_2d8 = (_List_node_base *)newHalfedge(in_stack_fffffffffffff988);
            std::
            vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
            ::push_back(in_stack_fffffffffffff930,(value_type *)in_stack_fffffffffffff928);
            pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                ((_List_iterator<CGL::Halfedge> *)0x13c842);
            pHVar17 = Halfedge::twin(pHVar18);
            pHVar17->_M_node = local_2d8;
            pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                ((_List_iterator<CGL::Halfedge> *)0x13c874);
            pHVar17 = Halfedge::twin(pHVar18);
            pHVar17->_M_node = local_2d0._M_node;
            pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                ((_List_iterator<CGL::Halfedge> *)0x13c8a6);
            pFVar10 = Halfedge::face(pHVar18);
            pFVar10->_M_node = local_2b0;
            pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                ((_List_iterator<CGL::Halfedge> *)0x13c8d8);
            Halfedge::next(pHVar18);
            pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                ((_List_iterator<CGL::Halfedge> *)0x13c8f7);
            pVVar11 = Halfedge::vertex(pHVar18);
            pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                ((_List_iterator<CGL::Halfedge> *)0x13c916);
            pVVar12 = Halfedge::vertex(pHVar18);
            pVVar12->_M_node = pVVar11->_M_node;
            local_2e0 = (_List_node_base *)newEdge(in_stack_fffffffffffff9e8);
            pEVar13 = std::_List_iterator<CGL::Edge>::operator->
                                ((_List_iterator<CGL::Edge> *)0x13c972);
            pHVar17 = Edge::halfedge(pEVar13);
            pHVar17->_M_node = local_2d0._M_node;
            pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                ((_List_iterator<CGL::Halfedge> *)0x13c9a4);
            pEVar14 = Halfedge::edge(pHVar18);
            pEVar14->_M_node = local_2e0;
            pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                ((_List_iterator<CGL::Halfedge> *)0x13c9d6);
            pEVar14 = Halfedge::edge(pHVar18);
            pEVar14->_M_node = local_2e0;
            pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                ((_List_iterator<CGL::Halfedge> *)0x13ca08);
            pHVar17 = Halfedge::next(pHVar18);
            local_2d0._M_node = pHVar17->_M_node;
            while( true ) {
              bVar1 = std::operator!=(&local_2d0,&local_298);
              local_5c1 = false;
              if (bVar1) {
                pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                    ((_List_iterator<CGL::Halfedge> *)0x13ca61);
                pHVar17 = Halfedge::twin(pHVar18);
                local_2e8._M_node =
                     (_List_node_base *)
                     std::__cxx11::list<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>::end
                               (&in_stack_fffffffffffff918->halfedges);
                local_5c1 = std::operator!=(pHVar17,&local_2e8);
              }
              if (local_5c1 == false) break;
              pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                  ((_List_iterator<CGL::Halfedge> *)0x13cac1);
              pHVar17 = Halfedge::twin(pHVar18);
              local_2d0._M_node = pHVar17->_M_node;
              pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                  ((_List_iterator<CGL::Halfedge> *)0x13caf3);
              pHVar17 = Halfedge::next(pHVar18);
              local_2d0._M_node = pHVar17->_M_node;
            }
            bVar1 = std::operator!=(&local_2d0,&local_298);
          } while (bVar1);
          local_2f0 = std::
                      vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
                      ::size(&local_2c8);
          for (local_2f8 = 0; local_2f8 < local_2f0; local_2f8 = local_2f8 + 1) {
            local_300 = ((local_2f8 - 1) + local_2f0) % local_2f0;
            pvVar15 = std::
                      vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
                      ::operator[](&local_2c8,local_300);
            std::
            vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
            ::operator[](&local_2c8,local_2f8);
            pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                                ((_List_iterator<CGL::Halfedge> *)0x13cbfd);
            pHVar17 = Halfedge::next(pHVar18);
            pHVar17->_M_node = pvVar15->_M_node;
          }
          std::
          vector<std::_List_iterator<CGL::Halfedge>,_std::allocator<std::_List_iterator<CGL::Halfedge>_>_>
          ::~vector(in_stack_fffffffffffff930);
        }
        local_308 = (_List_node_base *)std::_List_iterator<CGL::Halfedge>::operator++(&local_298,0);
      }
      local_310._M_node = (_List_node_base *)verticesBegin(in_stack_fffffffffffff918);
      while( true ) {
        local_318._M_node = (_List_node_base *)verticesEnd(in_stack_fffffffffffff918);
        bVar1 = std::operator!=(&local_310,&local_318);
        if (!bVar1) break;
        pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                            ((_List_iterator<CGL::Vertex> *)0x13cce2);
        Vertex::halfedge(pVVar26);
        pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                            ((_List_iterator<CGL::Halfedge> *)0x13cd01);
        Halfedge::twin(pHVar18);
        pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                            ((_List_iterator<CGL::Halfedge> *)0x13cd20);
        pHVar17 = Halfedge::next(pHVar18);
        pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                            ((_List_iterator<CGL::Vertex> *)0x13cd3f);
        pHVar16 = Vertex::halfedge(pVVar26);
        pHVar16->_M_node = pHVar17->_M_node;
        local_320 = (_List_node_base *)std::_List_iterator<CGL::Vertex>::operator++(&local_310,0);
      }
      local_328._M_node =
           (_List_node_base *)
           std::__cxx11::list<CGL::Vertex,_std::allocator<CGL::Vertex>_>::begin
                     ((list<CGL::Vertex,_std::allocator<CGL::Vertex>_> *)in_stack_fffffffffffff918);
      while( true ) {
        local_330._M_node =
             (_List_node_base *)
             std::__cxx11::list<CGL::Vertex,_std::allocator<CGL::Vertex>_>::end
                       ((list<CGL::Vertex,_std::allocator<CGL::Vertex>_> *)in_stack_fffffffffffff918
                       );
        bVar1 = std::operator!=(&local_328,&local_330);
        if (!bVar1) {
          sVar21 = std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::size(local_18);
          sVar22 = std::__cxx11::list<CGL::Vertex,_std::allocator<CGL::Vertex>_>::size
                             ((list<CGL::Vertex,_std::allocator<CGL::Vertex>_> *)
                              in_stack_fffffffffffff920);
          if (sVar21 == sVar22) {
            local_354 = 0;
            local_368._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                 ::begin((map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                          *)in_stack_fffffffffffff918);
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>
            ::_Rb_tree_const_iterator(&local_360,&local_368);
            while( true ) {
              local_378._M_node =
                   (_Base_ptr)
                   std::
                   map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                   ::end((map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                          *)in_stack_fffffffffffff918);
              std::
              _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>
              ::_Rb_tree_const_iterator(&local_370,&local_378);
              bVar1 = std::operator!=(&local_360,&local_370);
              if (!bVar1) break;
              ppVar24 = std::
                        _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>
                        ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>
                                      *)0x13d1da);
              local_380 = (ppVar24->second)._M_node;
              pvVar25 = std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::operator[]
                                  (local_18,(long)local_354);
              pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                                  ((_List_iterator<CGL::Vertex> *)0x13d20d);
              (pVVar26->position).field_0.field_0.x = (pvVar25->field_0).field_0.x;
              (pVVar26->position).field_0.field_0.y = (pvVar25->field_0).field_0.y;
              (pVVar26->position).field_0.field_0.z = (pvVar25->field_0).field_0.z;
              *(undefined8 *)((long)&(pVVar26->position).field_0 + 0x18) =
                   *(undefined8 *)((long)&pvVar25->field_0 + 0x18);
              sVar21 = std::vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::size(local_20);
              if ((ulong)(long)local_354 < sVar21) {
                pvVar27 = std::vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::operator[]
                                    (local_20,(long)local_354);
                pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                                    ((_List_iterator<CGL::Vertex> *)0x13d272);
                (pVVar26->texcoord).x = pvVar27->x;
                (pVVar26->texcoord).y = pvVar27->y;
              }
              local_354 = local_354 + 1;
              local_388 = (_Base_ptr)
                          std::
                          _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>
                          ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>
                                        *)in_stack_fffffffffffff928,
                                       (int)((ulong)in_stack_fffffffffffff920 >> 0x20));
            }
            local_390._M_node = (_List_node_base *)verticesBegin(in_stack_fffffffffffff918);
            while( true ) {
              local_398._M_node = (_List_node_base *)verticesEnd(in_stack_fffffffffffff918);
              bVar1 = std::operator!=(&local_390,&local_398);
              if (!bVar1) break;
              std::_List_iterator<CGL::Vertex>::operator->((_List_iterator<CGL::Vertex> *)0x13d323);
              Vertex::computeNormal(in_stack_fffffffffffffb40);
              std::_List_iterator<CGL::Vertex>::operator++(&local_390,0);
            }
            std::
            map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
            ::~map((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CGL::Halfedge>_>_>_>
                    *)0x13d355);
            std::
            map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
            ::~map((map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                    *)0x13d362);
            std::
            map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
            ::~map((map<unsigned_long,_std::_List_iterator<CGL::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CGL::Vertex>_>_>_>
                    *)0x13d36f);
            return;
          }
          poVar23 = std::operator<<((ostream *)&std::cerr,
                                    "Error converting polygons to halfedge mesh: number of vertex positions is different from the number of distinct vertices!"
                                   );
          std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
          poVar23 = std::operator<<((ostream *)&std::cerr,"(number of positions in input: ");
          sVar21 = std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::size(local_18);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,sVar21);
          poVar23 = std::operator<<(poVar23,")");
          std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
          poVar23 = std::operator<<((ostream *)&std::cerr,"(  number of vertices in mesh: ");
          sVar21 = std::__cxx11::list<CGL::Vertex,_std::allocator<CGL::Vertex>_>::size
                             ((list<CGL::Vertex,_std::allocator<CGL::Vertex>_> *)
                              in_stack_fffffffffffff920);
          poVar23 = (ostream *)std::ostream::operator<<(poVar23,sVar21);
          poVar23 = std::operator<<(poVar23,")");
          std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                            ((_List_iterator<CGL::Vertex> *)0x13cde0);
        pHVar17 = Vertex::halfedge(pVVar26);
        local_338._M_node =
             (_List_node_base *)
             std::__cxx11::list<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>::end
                       (&in_stack_fffffffffffff918->halfedges);
        bVar1 = std::operator==(pHVar17,&local_338);
        if (bVar1) break;
        local_340 = 0;
        pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                            ((_List_iterator<CGL::Vertex> *)0x13ce78);
        pHVar17 = Vertex::halfedge(pVVar26);
        local_348._M_node = pHVar17->_M_node;
        do {
          pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                              ((_List_iterator<CGL::Halfedge> *)0x13ceaa);
          Halfedge::face(pHVar18);
          pFVar19 = std::_List_iterator<CGL::Face>::operator->
                              ((_List_iterator<CGL::Face> *)0x13cec9);
          bVar1 = Face::isBoundary(pFVar19);
          if (!bVar1) {
            local_340 = local_340 + 1;
          }
          pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                              ((_List_iterator<CGL::Halfedge> *)0x13cf08);
          Halfedge::twin(pHVar18);
          pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                              ((_List_iterator<CGL::Halfedge> *)0x13cf27);
          pHVar17 = Halfedge::next(pHVar18);
          local_348._M_node = pHVar17->_M_node;
          pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                              ((_List_iterator<CGL::Vertex> *)0x13cf59);
          pHVar17 = Vertex::halfedge(pVVar26);
          bVar1 = std::operator!=(&local_348,pHVar17);
        } while (bVar1);
        mVar29 = local_340;
        pmVar20 = std::
                  map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                  ::operator[]((map<std::_List_iterator<CGL::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CGL::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CGL::Vertex>,_unsigned_long>_>_>
                                *)in_stack_fffffffffffff960,(key_type *)in_stack_fffffffffffff958);
        if (mVar29 != *pmVar20) {
          poVar23 = std::operator<<((ostream *)&std::cerr,
                                    "Error converting polygons to halfedge mesh: at least one of the vertices is nonmanifold."
                                   );
          std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        local_350 = (_List_node_base *)std::_List_iterator<CGL::Vertex>::operator++(&local_328,0);
      }
      poVar23 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: some vertices are not referenced by any polygon."
                               );
      std::ostream::operator<<(poVar23,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    pVVar26 = std::_List_iterator<CGL::Vertex>::operator->((_List_iterator<CGL::Vertex> *)0x13c586);
    pHVar17 = Vertex::halfedge(pVVar26);
    local_280._M_node = pHVar17->_M_node;
    do {
      pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                          ((_List_iterator<CGL::Halfedge> *)0x13c5b8);
      pHVar17 = Halfedge::twin(pHVar18);
      local_288._M_node =
           (_List_node_base *)
           std::__cxx11::list<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>::end
                     (&in_stack_fffffffffffff918->halfedges);
      bVar1 = std::operator==(pHVar17,&local_288);
      if (bVar1) {
        pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                            ((_List_iterator<CGL::Vertex> *)0x13c607);
        pHVar17 = Vertex::halfedge(pVVar26);
        pHVar17->_M_node = local_280._M_node;
        break;
      }
      pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                          ((_List_iterator<CGL::Halfedge> *)0x13c657);
      Halfedge::twin(pHVar18);
      pHVar18 = std::_List_iterator<CGL::Halfedge>::operator->
                          ((_List_iterator<CGL::Halfedge> *)0x13c676);
      pHVar17 = Halfedge::next(pHVar18);
      local_280._M_node = pHVar17->_M_node;
      pVVar26 = std::_List_iterator<CGL::Vertex>::operator->
                          ((_List_iterator<CGL::Vertex> *)0x13c6a8);
      pHVar17 = Vertex::halfedge(pVVar26);
      bVar1 = std::operator!=(&local_280,pHVar17);
    } while (bVar1);
    local_290 = (_List_node_base *)std::_List_iterator<CGL::Vertex>::operator++(&local_270,0);
  } while( true );
}

Assistant:

void HalfedgeMesh::build(const vector<vector<Index> >& polygons,
                         const vector<Vector3D>& vertexPositions,
                         const vector<Vector2D>& texcoords)
// This method initializes the halfedge data structure from a raw list of
// polygons, where each input polygon is specified as a list of vertex indices.
// The input must describe a manifold, oriented surface, where the orientation
// of a polygon is determined by the order of vertices in the list. Polygons
// must have at least three vertices.  Note that there are no special conditions
// on the vertex indices, i.e., they do not have to start at 0 or 1, nor does
// the collection of indices have to be contiguous.  Overall, this initializer
// is designed to be robust but perhaps not incredibly fast (though of course
// this does not affect the performance of the resulting data structure).  One
// could also implement faster initializers that handle important special cases
// (e.g., all triangles, or data that is known to be manifold). Since there are
// no strong conditions on the indices of polygons, we assume that the list of
// vertex positions is given in lexicographic order (i.e., that the lowest index
// appearing in any polygon corresponds to the first entry of the list of
// positions and so on).
{
  // define some types, to improve readability
  typedef vector<Index> IndexList;
  typedef IndexList::const_iterator IndexListCIter;
  typedef vector<IndexList> PolygonList;
  typedef PolygonList::const_iterator PolygonListCIter;
  typedef pair<Index, Index> IndexPair;  // ordered pair of vertex indices,
                                         // corresponding to an edge of an
                                         // oriented polygon

  // Clear any existing elements.
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Since the vertices in our halfedge mesh are stored in a linked list,
  // we will temporarily need to keep track of the correspondence between
  // indices of vertices in our input and pointers to vertices in the new
  // mesh (which otherwise can't be accessed by index).  Note that since
  // we're using a general-purpose map (rather than, say, a vector), we can
  // be a bit more flexible about the indexing scheme: input vertex indices
  // aren't required to be 0-based or 1-based; in fact, the set of indices
  // doesn't even have to be contiguous.  Taking advantage of this fact makes
  // our conversion a bit more robust to different types of input, including
  // data that comes from a subset of a full mesh.

  // maps a vertex index to the corresponding vertex
  map<Index, VertexIter> indexToVertex;

  // Also store the vertex degree, i.e., the number of polygons that use each
  // vertex; this information will be used to check that the mesh is manifold.
  map<VertexIter, Size> vertexDegree;

  // First, we do some basic sanity checks on the input.
  for (PolygonListCIter p = polygons.begin(); p != polygons.end(); p++) {
    if (p->size() < 3) {
      // Refuse to build the mesh if any of the polygons have fewer than three
      // vertices.(Note that if we omit this check the code will still
      // constructsomething fairlymeaningful for 1- and 2-point polygons, but
      // enforcing this stricterrequirementon the input will help simplify code
      // further downstream, since it canbe certainit doesn't have to check for
      // these rather degenerate cases.)
      cerr << "Error converting polygons to halfedge mesh: each polygon must "
              "have at least three vertices." << endl;
      exit(1);
    }

    // We want to count the number of distinct vertex indices in this
    // polygon, to make sure it's the same as the number of vertices
    // in the polygon---if they disagree, then the polygon is not valid
    // (or at least, for simplicity we don't handle polygons of this type!).
    set<Index> polygonIndices;

    // loop over polygon vertices
    for (IndexListCIter i = p->begin(); i != p->end(); i++) {
      polygonIndices.insert(*i);

      // allocate one vertex for each new index we encounter
      if (indexToVertex.find(*i) == indexToVertex.end()) {
        VertexIter v = newVertex();
        v->halfedge() =
            halfedges.end();  // this vertex doesn't yet point to any halfedge
        indexToVertex[*i] = v;
        vertexDegree[v] = 1;  // we've now seen this vertex only once
      } else {
        // keep track of the number of times we've seen this vertex
        vertexDegree[indexToVertex[*i]]++;
      }

    }  // end loop over polygon vertices

    // check that all vertices of the current polygon are distinct
    Size degree = p->size();  // number of vertices in this polygon
    if (polygonIndices.size() < degree) {
      cerr << "Error converting polygons to halfedge mesh: one of the input "
              "polygons does not have distinct vertices!" << endl;
      cerr << "(vertex indices:";
      for (IndexListCIter i = p->begin(); i != p->end(); i++) {
        cerr << " " << *i;
      }
      cerr << ")" << endl;
      exit(1);
    }  // end check that polygon vertices are distinct

  }  // end basic sanity checks on input

  // The number of vertices in the mesh is the
  // number of unique indices seen in the input.
  Size nVertices = indexToVertex.size();

  // The number of faces is just the number of polygons in the input.
  Size nFaces = polygons.size();
  faces.resize(nFaces);  // allocate storage for faces in our new mesh

  // We will store a map from ordered pairs of vertex indices to
  // the corresponding halfedge object in our new (halfedge) mesh;
  // this map gets constructed during the next loop over polygons.
  map<IndexPair, HalfedgeIter> pairToHalfedge;

  // Next, we actually build the halfedge connectivity by again looping over
  // polygons
  PolygonListCIter p;
  FaceIter f;
  for (p = polygons.begin(), f = faces.begin(); p != polygons.end(); p++, f++) {
    vector<HalfedgeIter> faceHalfedges;  // cyclically ordered list of the half
                                         // edges of this face
    Size degree = p->size();             // number of vertices in this polygon

    // loop over the halfedges of this face (equivalently, the ordered pairs of
    // consecutive vertices)
    for (Index i = 0; i < degree; i++) {
      Index a = (*p)[i];                 // current index
      Index b = (*p)[(i + 1) % degree];  // next index, in cyclic order
      IndexPair ab(a, b);
      HalfedgeIter hab;

      // check if this halfedge already exists; if so, we have a problem!
      if (pairToHalfedge.find(ab) != pairToHalfedge.end()) {
        cerr << "Error converting polygons to halfedge mesh: found multiple "
                "oriented edges with indices (" << a << ", " << b << ")."
             << endl;
        cerr << "This means that either (i) more than two faces contain this "
                "edge (hence the surface is nonmanifold), or" << endl;
        cerr << "(ii) there are exactly two faces containing this edge, but "
                "they have the same orientation (hence the surface is" << endl;
        cerr << "not consistently oriented." << endl;
        exit(1);
      } else  // otherwise, the halfedge hasn't been allocated yet
      {
        // so, we point this vertex pair to a new halfedge
        hab = newHalfedge();
        pairToHalfedge[ab] = hab;

        // link the new halfedge to its face
        hab->face() = f;
        hab->face()->halfedge() = hab;

        // also link it to its starting vertex
        hab->vertex() = indexToVertex[a];
        hab->vertex()->halfedge() = hab;

        // keep a list of halfedges in this face, so that we can later
        // link them together in a loop (via their "next" pointers)
        faceHalfedges.push_back(hab);
      }

      // Also, check if the twin of this halfedge has already been constructed
      // (during construction of a different face).  If so, link the twins
      // together and allocate their shared halfedge.  By the end of this pass
      // over polygons, the only halfedges that will not have a twin will hence
      // be those that sit along the domain boundary.
      IndexPair ba(b, a);
      map<IndexPair, HalfedgeIter>::iterator iba = pairToHalfedge.find(ba);
      if (iba != pairToHalfedge.end()) {
        HalfedgeIter hba = iba->second;

        // link the twins
        hab->twin() = hba;
        hba->twin() = hab;

        // allocate and link their edge
        EdgeIter e = newEdge();
        hab->edge() = e;
        hba->edge() = e;
        e->halfedge() = hab;
      } else { // If we didn't find a twin...
        // ...mark this halfedge as being twinless by pointing
        // it to the end of the list of halfedges. If it remains
        // twinless by the end of the current loop over polygons,
        // it will be linked to a boundary face in the next pass.
        hab->twin() = halfedges.end();
      }

    }  // end loop over the current polygon's halfedges

    // Now that all the halfedges of this face have been allocated,
    // we can link them together via their "next" pointers.
    for (Index i = 0; i < degree; i++) {
      Index j =
          (i + 1) % degree;  // index of the next halfedge, in cyclic order
      faceHalfedges[i]->next() = faceHalfedges[j];
    }

  }  // done building basic halfedge connectivity

  // For each vertex on the boundary, advance its halfedge pointer to one that
  // is also on the boundary.
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
    // loop over halfedges around vertex
    HalfedgeIter h = v->halfedge();
    do {
      if (h->twin() == halfedges.end()) {
        v->halfedge() = h;
        break;
      }

      h = h->twin()->next();
    } while (h != v->halfedge());  // end loop over halfedges around vertex

  }  // done advancing halfedge pointers for boundary vertices

  // Next we construct new faces for each boundary component.
  for (HalfedgeIter h = halfedgesBegin(); h != halfedgesEnd();
       h++)  // loop over all halfedges
  {
    // Any halfedge that does not yet have a twin is on the boundary of the
    // domain. If we follow the boundary around long enough we will of course
    // eventually make a closed loop; we can represent this boundary loop by a
    // new face. To make clear the distinction between faces and boundary loops,
    // the boundary face will (i) have a flag indicating that it is a boundary
    // loop, and (ii) be stored in a list of boundaries, rather than the usual
    // list of faces.  The reason we need the both the flag *and* the separate
    // list is that faces are often accessed in two fundamentally different
    // ways: either by (i) local traversal of the neighborhood of some mesh
    // element using the halfedge structure, or (ii) global traversal of all
    // faces (or boundary loops).
    if (h->twin() == halfedges.end()) {
      FaceIter b = newBoundary();
      vector<HalfedgeIter> boundaryHalfedges;  // keep a list of halfedges along
                                               // the boundary, so we can link
                                               // them together

      // We now need to walk around the boundary, creating new
      // halfedges and edges along the boundary loop as we go.
      HalfedgeIter i = h;
      do {
        // create a twin, which becomes a halfedge of the boundary loop
        HalfedgeIter t = newHalfedge();
        boundaryHalfedges.push_back(
            t);  // keep a list of all boundary halfedges, in cyclic order
        i->twin() = t;
        t->twin() = i;
        t->face() = b;
        t->vertex() = i->next()->vertex();

        // create the shared edge
        EdgeIter e = newEdge();
        e->halfedge() = i;
        i->edge() = e;
        t->edge() = e;

        // Advance i to the next halfedge along the current boundary loop
        // by walking around its target vertex and stopping as soon as we
        // find a halfedge that does not yet have a twin defined.
        i = i->next();
        while (i != h &&  // we're done if we end up back at the beginning of
                          // the loop
               i->twin() != halfedges.end())  // otherwise, we're looking for
                                              // the next twinless halfedge
                                              // along the loop
        {
          i = i->twin();
          i = i->next();
        }
      } while (i != h);

      // The only pointers that still need to be set are the "next" pointers of
      // the twins; these we can set from the list of boundary halfedges, but we
      // must use the opposite order from the order in the list, since the
      // orientation of the boundary loop is opposite the orientation of the
      // halfedges "inside" the domain boundary.
      Size degree = boundaryHalfedges.size();
      for (Index p = 0; p < degree; p++) {
        Index q = (p - 1 + degree) % degree;
        boundaryHalfedges[p]->next() = boundaryHalfedges[q];
      }

    }  // end construction of one of the boundary loops

    // Note that even though we are looping over all halfedges, we will still
    // construct the appropriate number of boundary loops (and not, say, one
    // loop per boundary halfedge).  The reason is that as we continue to
    // iterate through halfedges, we check whether their twin has been assigned,
    // and since new twins may have been assigned earlier in this loop, we will
    // end up skipping many subsequent halfedges.

  }  // done adding "virtual" faces corresponding to boundary loops

  // To make later traversal of the mesh easier, we will now advance the
  // halfedge
  // associated with each vertex such that it refers to the *first* non-boundary
  // halfedge, rather than the last one.
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
    v->halfedge() = v->halfedge()->twin()->next();
  }

  // Finally, we check that all vertices are manifold.
  for (VertexIter v = vertices.begin(); v != vertices.end(); v++) {
    // First check that this vertex is not a "floating" vertex;
    // if it is then we do not have a valid 2-manifold surface.
    if (v->halfedge() == halfedges.end()) {
      cerr << "Error converting polygons to halfedge mesh: some vertices are "
              "not referenced by any polygon." << endl;
      exit(1);
    }

    // Next, check that the number of halfedges emanating from this vertex in
    // our half edge data structure equals the number of polygons containing
    // this vertex, which we counted during our first pass over the mesh.  If
    // not, then our vertex is not a "fan" of polygons, but instead has some
    // other (nonmanifold) structure.
    Size count = 0;
    HalfedgeIter h = v->halfedge();
    do {
      if (!h->face()->isBoundary()) {
        count++;
      }
      h = h->twin()->next();
    } while (h != v->halfedge());

    if (count != vertexDegree[v]) {
      cerr << "Error converting polygons to halfedge mesh: at least one of the "
              "vertices is nonmanifold." << endl;
      exit(1);
    }
  }  // end loop over vertices

  // Now that we have the connectivity, we copy the list of vertex
  // positions into member variables of the individual vertices.
  if (vertexPositions.size() != vertices.size()) {
    cerr << "Error converting polygons to halfedge mesh: number of vertex "
            "positions is different from the number of distinct vertices!"
         << endl;
    cerr << "(number of positions in input: " << vertexPositions.size() << ")"
         << endl;
    cerr << "(  number of vertices in mesh: " << vertices.size() << ")" << endl;
    exit(1);
  }
  // Since an STL map internally sorts its keys, we can iterate over the map
  // from vertex indices to vertex iterators to visit our (input) vertices in
  // lexicographic order
  int i = 0;
  for (map<Index, VertexIter>::const_iterator e = indexToVertex.begin();
       e != indexToVertex.end(); e++) {
    // grab a pointer to the vertex associated with the current key (i.e., the
    // current index)
    VertexIter v = e->second;

    // set the att of this vertex to the corresponding
    // position in the input
    v->position = vertexPositions[i];

    if (texcoords.size() > i) {
        v->texcoord = texcoords[i];
//        printf("%f %f\n", v->texcoord.x, v->texcoord.y);
    }

    i++;
  }

  // compute initial normals
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
    v->computeNormal();
  }

}